

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void __thiscall MD5::MD5::encode(MD5 *this,bit32 *input,byte *output,size_t length)

{
  ulong local_38;
  size_t j;
  size_t i;
  size_t length_local;
  byte *output_local;
  bit32 *input_local;
  MD5 *this_local;
  
  j = 0;
  for (local_38 = 0; local_38 < length; local_38 = local_38 + 4) {
    output[local_38] = (byte)input[j];
    output[local_38 + 1] = (byte)(input[j] >> 8);
    output[local_38 + 2] = (byte)(input[j] >> 0x10);
    output[local_38 + 3] = (byte)(input[j] >> 0x18);
    j = j + 1;
  }
  return;
}

Assistant:

void MD5::encode(const bit32* input, byte* output, size_t length) {

  for (size_t i = 0, j = 0; j < length; ++i, j += 4) {
    output[j]= (byte)(input[i] & 0xff);
    output[j + 1] = (byte)((input[i] >> 8) & 0xff);
    output[j + 2] = (byte)((input[i] >> 16) & 0xff);
    output[j + 3] = (byte)((input[i] >> 24) & 0xff);
  }
}